

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompilerLibrary.cpp
# Opt level: O0

void __thiscall Diligent::DXCompilerLibrary::DetectMaxShaderModel(DXCompilerLibrary *this)

{
  DxcCreateInstanceProc p_Var1;
  ShaderVersion SVar2;
  bool bVar3;
  HRESULT HVar4;
  int iVar5;
  Char *Message;
  IDxcLibrary **pp;
  void **ppvVar6;
  IDxcCompiler **pp_00;
  IDxcLibrary *pIVar7;
  IDxcBlobEncoding **ppIVar8;
  IDxcCompiler *pIVar9;
  IDxcBlobEncoding *pIVar10;
  undefined8 uVar11;
  size_type sVar12;
  IDxcOperationResult **ppIVar13;
  IDxcOperationResult *pIVar14;
  char (*in_RCX) [31];
  wchar_t **local_1e0;
  string _msg;
  int local_140;
  HRESULT status;
  HRESULT hr_3;
  CComPtr<IDxcOperationResult> pdxcResult;
  allocator<wchar_t> local_109;
  wstring local_108 [8];
  wstring Profile;
  wchar_t *pwStack_e0;
  Uint32 MinorVer;
  undefined1 local_d8 [8];
  vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> DxilArgs;
  wchar_t wStack_b8;
  ShaderVersion MaxSM;
  HRESULT hr_2;
  CComPtr<IDxcBlobEncoding> pSourceBlob;
  char TestShader [72];
  HRESULT hr_1;
  CComPtr<IDxcCompiler> pdxcCompiler;
  HRESULT hr;
  CComPtr<IDxcLibrary> pdxcLibrary;
  undefined1 local_30 [8];
  string msg;
  DXCompilerLibrary *this_local;
  
  msg.field_2._8_8_ = this;
  if (this->m_DxcCreateInstance == (DxcCreateInstanceProc)0x0) {
    FormatString<char[26],char[31]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_DxcCreateInstance != nullptr",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"DetectMaxShaderModel",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompilerLibrary.cpp"
               ,0x4d);
    std::__cxx11::string::~string((string *)local_30);
  }
  CComPtr<IDxcLibrary>::CComPtr((CComPtr<IDxcLibrary> *)&stack0xffffffffffffffb8);
  p_Var1 = this->m_DxcCreateInstance;
  pp = CComPtrBase<IDxcLibrary>::operator&((CComPtrBase<IDxcLibrary> *)&stack0xffffffffffffffb8);
  ppvVar6 = IID_PPV_ARGS_Helper<IDxcLibrary>(pp);
  pdxcCompiler.super_CComPtrBase<IDxcCompiler>.p._4_4_ =
       (*p_Var1)(&CLSID_DxcLibrary,(REFIID)_GUID_e5204dc7_d18c_4c3c_bdfb_851673980fe7,ppvVar6);
  if (pdxcCompiler.super_CComPtrBase<IDxcCompiler>.p._4_4_ < 0) {
    LogError<true,char[29]>
              (false,"DetectMaxShaderModel",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompilerLibrary.cpp"
               ,0x51,(char (*) [29])"Failed to create DXC Library");
  }
  CComPtr<IDxcCompiler>::CComPtr((CComPtr<IDxcCompiler> *)&stack0xffffffffffffffa8);
  p_Var1 = this->m_DxcCreateInstance;
  pp_00 = CComPtrBase<IDxcCompiler>::operator&
                    ((CComPtrBase<IDxcCompiler> *)&stack0xffffffffffffffa8);
  ppvVar6 = IID_PPV_ARGS_Helper<IDxcCompiler>(pp_00);
  HVar4 = (*p_Var1)(&CLSID_DxcCompiler,(REFIID)_GUID_8c210bf3_011f_4422_8d70_6f9acb8db617,ppvVar6);
  if (HVar4 < 0) {
    LogError<true,char[30]>
              (false,"DetectMaxShaderModel",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompilerLibrary.cpp"
               ,0x54,(char (*) [30])"Failed to create DXC Compiler");
  }
  memcpy(&pSourceBlob,"\nfloat4 main() : SV_Target0\n{\n    return float4(0.0, 0.0, 0.0, 0.0);\n}\n"
         ,0x48);
  CComPtr<IDxcBlobEncoding>::CComPtr((CComPtr<IDxcBlobEncoding> *)&MaxSM.Minor);
  pIVar7 = CComPtrBase<IDxcLibrary>::operator->
                     ((CComPtrBase<IDxcLibrary> *)&stack0xffffffffffffffb8);
  ppIVar8 = CComPtrBase<IDxcBlobEncoding>::operator&((CComPtrBase<IDxcBlobEncoding> *)&MaxSM.Minor);
  MaxSM.Major = (**(code **)(*(long *)pIVar7 + 0x30))(pIVar7,&pSourceBlob,0x48,0xfde9,ppIVar8);
  if ((int)MaxSM.Major < 0) {
    LogError<true,char[35]>
              (false,"DetectMaxShaderModel",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompilerLibrary.cpp"
               ,0x5e,(char (*) [35])"Failed to create DXC Blob Encoding");
  }
  Version::Version((Version *)
                   ((long)&DxilArgs.
                           super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 4),6,0);
  std::vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>::vector
            ((vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> *)local_d8);
  if (this->m_Target == Vulkan) {
    pwStack_e0 = L"-spirv";
    std::vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>::push_back
              ((vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> *)local_d8,
               &stack0xffffffffffffff20);
  }
  Profile.field_2._M_local_buf[3] = L'\x01';
  while( true ) {
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_108,L"ps_6_",&local_109);
    std::allocator<wchar_t>::~allocator(&local_109);
    std::__cxx11::to_wstring((wstring *)&pdxcResult,Profile.field_2._M_local_buf[3]);
    std::__cxx11::wstring::operator+=(local_108,(wstring *)&pdxcResult);
    std::__cxx11::wstring::~wstring((wstring *)&pdxcResult);
    CComPtr<IDxcOperationResult>::CComPtr((CComPtr<IDxcOperationResult> *)&stack0xfffffffffffffec8);
    pIVar9 = CComPtrBase<IDxcCompiler>::operator->
                       ((CComPtrBase<IDxcCompiler> *)&stack0xffffffffffffffa8);
    pIVar10 = CComPtrBase::operator_cast_to_IDxcBlobEncoding_((CComPtrBase *)&MaxSM.Minor);
    uVar11 = std::__cxx11::wstring::c_str();
    bVar3 = std::vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>::empty
                      ((vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> *)local_d8);
    if (bVar3) {
      local_1e0 = (wchar_t **)0x0;
    }
    else {
      local_1e0 = std::vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>::data
                            ((vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> *)local_d8);
    }
    sVar12 = std::vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>::size
                       ((vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> *)local_d8);
    ppIVar13 = CComPtrBase<IDxcOperationResult>::operator&
                         ((CComPtrBase<IDxcOperationResult> *)&stack0xfffffffffffffec8);
    iVar5 = (**(code **)(*(long *)pIVar9 + 0x18))
                      (pIVar9,pIVar10,L"",L"main",uVar11,local_1e0,(int)sVar12,0,0,0,ppIVar13);
    if (iVar5 < 0) {
      local_140 = 0x12;
    }
    else {
      _msg.field_2._12_4_ = 0x80004005;
      pIVar14 = CComPtrBase<IDxcOperationResult>::operator->
                          ((CComPtrBase<IDxcOperationResult> *)&stack0xfffffffffffffec8);
      iVar5 = (**(code **)(*(long *)pIVar14 + 0x18))
                        (pIVar14,(undefined1 *)((long)&_msg.field_2 + 0xc));
      if (iVar5 < 0) {
        local_140 = 0x12;
      }
      else if ((int)_msg.field_2._12_4_ < 0) {
        local_140 = 0x12;
      }
      else {
        wStack_b8 = Profile.field_2._M_local_buf[3];
        local_140 = 0;
      }
    }
    CComPtr<IDxcOperationResult>::~CComPtr((CComPtr<IDxcOperationResult> *)&stack0xfffffffffffffec8)
    ;
    std::__cxx11::wstring::~wstring(local_108);
    if (local_140 != 0) break;
    Profile.field_2._M_local_buf[3] = Profile.field_2._M_local_buf[3] + L'\x01';
  }
  SVar2.Minor = wStack_b8;
  SVar2.Major = DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  this->m_MaxShaderModel = SVar2;
  std::vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>::~vector
            ((vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> *)local_d8);
  CComPtr<IDxcBlobEncoding>::~CComPtr((CComPtr<IDxcBlobEncoding> *)&MaxSM.Minor);
  CComPtr<IDxcCompiler>::~CComPtr((CComPtr<IDxcCompiler> *)&stack0xffffffffffffffa8);
  CComPtr<IDxcLibrary>::~CComPtr((CComPtr<IDxcLibrary> *)&stack0xffffffffffffffb8);
  return;
}

Assistant:

void DXCompilerLibrary::DetectMaxShaderModel()
{
    VERIFY_EXPR(m_DxcCreateInstance != nullptr);
    try
    {
        CComPtr<IDxcLibrary> pdxcLibrary;
        CHECK_D3D_RESULT(m_DxcCreateInstance(CLSID_DxcLibrary, IID_PPV_ARGS(&pdxcLibrary)), "Failed to create DXC Library");

        CComPtr<IDxcCompiler> pdxcCompiler;
        CHECK_D3D_RESULT(m_DxcCreateInstance(CLSID_DxcCompiler, IID_PPV_ARGS(&pdxcCompiler)), "Failed to create DXC Compiler");

        constexpr char TestShader[] = R"(
float4 main() : SV_Target0
{
    return float4(0.0, 0.0, 0.0, 0.0);
}
)";

        CComPtr<IDxcBlobEncoding> pSourceBlob;
        CHECK_D3D_RESULT(pdxcLibrary->CreateBlobWithEncodingFromPinned(TestShader, sizeof(TestShader), CP_UTF8, &pSourceBlob), "Failed to create DXC Blob Encoding");

        ShaderVersion MaxSM{6, 0};

        std::vector<const wchar_t*> DxilArgs;
        if (m_Target == DXCompilerTarget::Vulkan)
            DxilArgs.push_back(L"-spirv");

        for (Uint32 MinorVer = 1;; ++MinorVer)
        {
            std::wstring Profile = L"ps_6_";
            Profile += std::to_wstring(MinorVer);

            CComPtr<IDxcOperationResult> pdxcResult;

            auto hr = pdxcCompiler->Compile(
                pSourceBlob,
                L"",
                L"main",
                Profile.c_str(),
                !DxilArgs.empty() ? DxilArgs.data() : nullptr,
                static_cast<UINT32>(DxilArgs.size()),
                nullptr, // Array of defines
                0,       // Number of defines
                nullptr, // Include handler
                &pdxcResult);
            if (FAILED(hr))
                break;

            HRESULT status = E_FAIL;
            if (FAILED(pdxcResult->GetStatus(&status)))
                break;
            if (FAILED(status))
                break;

            MaxSM.Minor = MinorVer;
        }

        m_MaxShaderModel = MaxSM;
    }
    catch (...)
    {
        LOG_ERROR_MESSAGE("Failed to detect max shader model for DXC compiler");
    }
}